

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall cmMakefileTargetGenerator::WriteTargetDependRules(cmMakefileTargetGenerator *this)

{
  string *localPath;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmGeneratedFileStream *pcVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  char *pcVar7;
  _Alloc_hider _Var8;
  allocator local_42c;
  allocator local_42b;
  allocator local_42a;
  allocator local_429;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string depTarget;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string dir;
  ostringstream depCmd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    _vptr_cmLocalGenerator[0xc])
            (&dir,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  localPath = &this->InfoFileNameFull;
  std::__cxx11::string::_M_assign((string *)localPath);
  std::__cxx11::string::append((char *)localPath);
  cmLocalUnixMakefileGenerator3::ConvertToFullPath((string *)&depCmd,this->LocalGenerator,localPath)
  ;
  std::__cxx11::string::operator=((string *)localPath,(string *)&depCmd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_depCmd != local_198) {
    operator_delete(_depCmd,local_198[0]._M_allocated_capacity + 1);
  }
  pcVar4 = (cmGeneratedFileStream *)operator_new(0x248);
  cmGeneratedFileStream::cmGeneratedFileStream(pcVar4,(localPath->_M_dataplus)._M_p,false,None);
  this->InfoFileStream = pcVar4;
  cmGeneratedFileStream::SetCopyIfDifferent(pcVar4,true);
  pcVar4 = this->InfoFileStream;
  if (((&(pcVar4->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(pcVar4->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    cmLocalUnixMakefileGenerator3::WriteDependLanguageInfo
              (this->LocalGenerator,(ostream *)pcVar4,
               (this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pcVar4 = this->InfoFileStream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar4,"# Pairs of files generated by the same build rule.\n",0x33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pcVar4,"set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n",0x20);
      p_Var6 = (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var6 != p_Var1) {
        do {
          pcVar4 = this->InfoFileStream;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"  ",2);
          cmOutputConverter::EscapeForCMake((string *)&depCmd,(string *)(p_Var6 + 1));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)pcVar4,_depCmd,(long)local_1a0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          cmOutputConverter::EscapeForCMake(&local_408,(string *)(p_Var6 + 2));
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_408._M_dataplus._M_p,local_408._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_depCmd != local_198) {
            operator_delete(_depCmd,local_198[0]._M_allocated_capacity + 1);
          }
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != p_Var1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this->InfoFileStream,"  )\n\n",5);
    }
    pcVar4 = this->InfoFileStream;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar4,"# Targets to which this target links.\n",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar4,"set(CMAKE_TARGET_LINKED_INFO_FILES\n",0x23);
    cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&depCmd,&this->super_cmCommonTargetGenerator);
    for (_Var8._M_p = _depCmd;
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var8._M_p != local_1a0; _Var8._M_p = _Var8._M_p + 0x20) {
      pcVar4 = this->InfoFileStream;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"  \"",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)pcVar4,*(char **)_Var8._M_p,*(long *)(_Var8._M_p + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/DependInfo.cmake\"\n",0x13);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this->InfoFileStream,"  )\n",4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&depCmd);
    pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::string((string *)&local_408,pcVar7,(allocator *)&depCmd);
    pcVar4 = this->InfoFileStream;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar4,"# Fortran module output directory.\n",0x23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar4,"set(CMAKE_Fortran_TARGET_MODULE_DIR \"",0x25);
    cmGeneratorTarget::GetFortranModuleDirectory
              ((string *)&depCmd,(this->super_cmCommonTargetGenerator).GeneratorTarget,&local_408);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar4,_depCmd,(long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_depCmd != local_198) {
      operator_delete(_depCmd,local_198[0]._M_allocated_capacity + 1);
    }
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
              (&depTarget,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    std::__cxx11::string::append((char *)&depTarget);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&depCmd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&depCmd,"cd ",3);
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar3);
    std::__cxx11::string::string((string *)&local_3e8,pcVar7,(allocator *)&local_2e8);
    cmsys::SystemTools::CollapseFullPath(&local_3c8,&local_3e8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_428,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_3c8,SHELL);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&depCmd,local_428._M_dataplus._M_p,local_428._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," && ",4);
    paVar2 = &local_428.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&depCmd,"$(CMAKE_COMMAND) -E cmake_depends \"",0x23);
    (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
      _vptr_cmGlobalGenerator[3])(&local_428);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&depCmd,local_428._M_dataplus._M_p,local_428._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetSourceDirectory((cmLocalGenerator *)pcVar3);
    std::__cxx11::string::string((string *)&local_2e8,pcVar7,&local_429);
    cmsys::SystemTools::CollapseFullPath(&local_3e8,&local_2e8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_3c8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_3e8,SHELL);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_3c8._M_dataplus._M_p,local_3c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetCurrentSourceDirectory((cmLocalGenerator *)pcVar3);
    std::__cxx11::string::string((string *)&local_208,pcVar7,&local_42a);
    cmsys::SystemTools::CollapseFullPath(&local_1e8,&local_208);
    cmOutputConverter::ConvertToOutputFormat
              (&local_308,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_1e8,SHELL);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_308._M_dataplus._M_p,local_308._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar3);
    std::__cxx11::string::string((string *)&local_248,pcVar7,&local_42b);
    cmsys::SystemTools::CollapseFullPath(&local_228,&local_248);
    cmOutputConverter::ConvertToOutputFormat
              (&local_328,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_228,SHELL);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_328._M_dataplus._M_p,local_328._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)pcVar3);
    std::__cxx11::string::string((string *)&local_288,pcVar7,&local_42c);
    cmsys::SystemTools::CollapseFullPath(&local_268,&local_288);
    cmOutputConverter::ConvertToOutputFormat
              (&local_348,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_268,SHELL);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_348._M_dataplus._M_p,local_348._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    pcVar3 = this->LocalGenerator;
    cmsys::SystemTools::CollapseFullPath(&local_2a8,localPath);
    cmOutputConverter::ConvertToOutputFormat
              (&local_368,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_2a8,SHELL);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_368._M_dataplus._M_p,local_368._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if (this->LocalGenerator->ColorMakefile == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&depCmd," --color=$(COLOR)",0x11);
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != paVar2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if (this->CustomCommandDriver == OnDepends) {
      DriveCustomCommands(this,&depends);
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,(ostream *)this->BuildFileStream,(char *)0x0,&depTarget,&depends
               ,&commands,true,false);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&depCmd);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)depTarget._M_dataplus._M_p != &depTarget.field_2) {
      operator_delete(depTarget._M_dataplus._M_p,depTarget.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&commands);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&depends);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dir._M_dataplus._M_p != &dir.field_2) {
    operator_delete(dir._M_dataplus._M_p,dir.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetDependRules()
{
  // must write the targets depend info file
  std::string dir =
    this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget);
  this->InfoFileNameFull = dir;
  this->InfoFileNameFull += "/DependInfo.cmake";
  this->InfoFileNameFull =
    this->LocalGenerator->ConvertToFullPath(this->InfoFileNameFull);
  this->InfoFileStream =
    new cmGeneratedFileStream(this->InfoFileNameFull.c_str());
  this->InfoFileStream->SetCopyIfDifferent(true);
  if (!*this->InfoFileStream) {
    return;
  }
  this->LocalGenerator->WriteDependLanguageInfo(*this->InfoFileStream,
                                                this->GeneratorTarget);

  // Store multiple output pairs in the depend info file.
  if (!this->MultipleOutputPairs.empty()) {
    /* clang-format off */
    *this->InfoFileStream
      << "\n"
      << "# Pairs of files generated by the same build rule.\n"
      << "set(CMAKE_MULTIPLE_OUTPUT_PAIRS\n";
    /* clang-format on */
    for (MultipleOutputPairsType::const_iterator pi =
           this->MultipleOutputPairs.begin();
         pi != this->MultipleOutputPairs.end(); ++pi) {
      *this->InfoFileStream
        << "  " << cmOutputConverter::EscapeForCMake(pi->first) << " "
        << cmOutputConverter::EscapeForCMake(pi->second) << "\n";
    }
    *this->InfoFileStream << "  )\n\n";
  }

  // Store list of targets linked directly or transitively.
  {
    /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Targets to which this target links.\n"
    << "set(CMAKE_TARGET_LINKED_INFO_FILES\n";
    /* clang-format on */
    std::vector<std::string> dirs = this->GetLinkedTargetDirectories();
    for (std::vector<std::string>::iterator i = dirs.begin(); i != dirs.end();
         ++i) {
      *this->InfoFileStream << "  \"" << *i << "/DependInfo.cmake\"\n";
    }
    *this->InfoFileStream << "  )\n";
  }

  std::string const& working_dir =
    this->LocalGenerator->GetCurrentBinaryDirectory();

  /* clang-format off */
  *this->InfoFileStream
    << "\n"
    << "# Fortran module output directory.\n"
    << "set(CMAKE_Fortran_TARGET_MODULE_DIR \""
    << this->GeneratorTarget->GetFortranModuleDirectory(working_dir)
    << "\")\n";
  /* clang-format on */

  // and now write the rule to use it
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Construct the name of the dependency generation target.
  std::string depTarget =
    this->LocalGenerator->GetRelativeTargetDirectory(this->GeneratorTarget);
  depTarget += "/depend";

  // Add a command to call CMake to scan dependencies.  CMake will
  // touch the corresponding depends file after scanning dependencies.
  std::ostringstream depCmd;
// TODO: Account for source file properties and directory-level
// definitions when scanning for dependencies.
#if !defined(_WIN32) || defined(__CYGWIN__)
  // This platform supports symlinks, so cmSystemTools will translate
  // paths.  Make sure PWD is set to the original name of the home
  // output directory to help cmSystemTools to create the same
  // translation table for the dependency scanning process.
  depCmd << "cd " << (this->LocalGenerator->ConvertToOutputFormat(
                       cmSystemTools::CollapseFullPath(
                         this->LocalGenerator->GetBinaryDirectory()),
                       cmOutputConverter::SHELL))
         << " && ";
#endif
  // Generate a call this signature:
  //
  //   cmake -E cmake_depends <generator>
  //                          <home-src-dir> <start-src-dir>
  //                          <home-out-dir> <start-out-dir>
  //                          <dep-info> --color=$(COLOR)
  //
  // This gives the dependency scanner enough information to recreate
  // the state of our local generator sufficiently for its needs.
  depCmd << "$(CMAKE_COMMAND) -E cmake_depends \""
         << this->GlobalGenerator->GetName() << "\" "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetSourceDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetCurrentSourceDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetBinaryDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(
                this->LocalGenerator->GetCurrentBinaryDirectory()),
              cmOutputConverter::SHELL)
         << " "
         << this->LocalGenerator->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(this->InfoFileNameFull),
              cmOutputConverter::SHELL);
  if (this->LocalGenerator->GetColorMakefile()) {
    depCmd << " --color=$(COLOR)";
  }
  commands.push_back(depCmd.str());

  // Make sure all custom command outputs in this target are built.
  if (this->CustomCommandDriver == OnDepends) {
    this->DriveCustomCommands(depends);
  }

  // Write the rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, CM_NULLPTR,
                                      depTarget, depends, commands, true);
}